

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall
NumericArgTest_MakeAndVisit_Test<unsigned_int>::TestBody
          (NumericArgTest_MakeAndVisit_Test<unsigned_int> *this)

{
  MockSpec<test_result_(unsigned_int)> *pMVar1;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<unsigned_int>_> visitor;
  
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&visitor);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&arg,0x2a);
  pMVar1 = mock_visitor<unsigned_int>::gmock_visit
                     (&visitor.super_mock_visitor<unsigned_int>,(Matcher<unsigned_int> *)&arg);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x152,"visitor","visit(expected)");
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&arg);
  arg.type_ = uint_type;
  arg.value_.field_0.long_long_value = 0x2a;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&visitor,&arg);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&visitor);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&visitor);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&arg,0x2a);
  pMVar1 = mock_visitor<unsigned_int>::gmock_visit
                     (&visitor.super_mock_visitor<unsigned_int>,(Matcher<unsigned_int> *)&arg);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x152,"visitor","visit(expected)");
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&arg);
  arg.type_ = uint_type;
  arg.value_.field_0.long_long_value = 0x2a;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&visitor,(basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                       *)&arg);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&visitor);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&visitor);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&arg,0);
  pMVar1 = mock_visitor<unsigned_int>::gmock_visit
                     (&visitor.super_mock_visitor<unsigned_int>,(Matcher<unsigned_int> *)&arg);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x153,"visitor","visit(expected)");
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&arg);
  arg.type_ = uint_type;
  arg.value_.field_0.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&visitor,&arg);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&visitor);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&visitor);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&arg,0);
  pMVar1 = mock_visitor<unsigned_int>::gmock_visit
                     (&visitor.super_mock_visitor<unsigned_int>,(Matcher<unsigned_int> *)&arg);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x153,"visitor","visit(expected)");
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&arg);
  arg.type_ = uint_type;
  arg.value_.field_0.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&visitor,(basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                       *)&arg);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&visitor);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&visitor);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&arg,0xffffffff);
  pMVar1 = mock_visitor<unsigned_int>::gmock_visit
                     (&visitor.super_mock_visitor<unsigned_int>,(Matcher<unsigned_int> *)&arg);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x154,"visitor","visit(expected)");
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&arg);
  arg.type_ = uint_type;
  arg.value_.field_0.long_long_value = 0xffffffff;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&visitor,&arg);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&visitor);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&visitor);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&arg,0xffffffff);
  pMVar1 = mock_visitor<unsigned_int>::gmock_visit
                     (&visitor.super_mock_visitor<unsigned_int>,(Matcher<unsigned_int> *)&arg);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x154,"visitor","visit(expected)");
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&arg);
  arg.type_ = uint_type;
  arg.value_.field_0.long_long_value = 0xffffffff;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&visitor,(basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                       *)&arg);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&visitor);
  return;
}

Assistant:

TYPED_TEST(NumericArgTest, MakeAndVisit) {
  CHECK_ARG(test_value<TypeParam>(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::min(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::max(), typename);
}